

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O0

uint64_t uv_get_free_memory(void)

{
  int iVar1;
  uint64_t rc;
  sysinfo info;
  
  info._104_8_ = uv__read_proc_meminfo("MemAvailable:");
  if (info._104_8_ == 0) {
    iVar1 = sysinfo((sysinfo *)&rc);
    if (iVar1 == 0) {
      info._104_8_ = info.totalram * (uint)info.freehigh;
    }
    else {
      info.mem_unit = 0;
      info._108_4_ = 0;
    }
  }
  return info._104_8_;
}

Assistant:

uint64_t uv_get_free_memory(void) {
  struct sysinfo info;
  uint64_t rc;

  rc = uv__read_proc_meminfo("MemAvailable:");

  if (rc != 0)
    return rc;

  if (0 == sysinfo(&info))
    return (uint64_t) info.freeram * info.mem_unit;

  return 0;
}